

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::UninterpretedOption::_InternalParse
          (UninterpretedOption *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  Arena *this_00;
  uint64 uVar2;
  ParseContext *in_RDX;
  char *in_RSI;
  ParseContext *in_RDI;
  double dVar3;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  ParseContext *in_stack_ffffffffffffffa8;
  ParseContext *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  HasBits in_stack_ffffffffffffffd4;
  char *local_20;
  
  memset(&stack0xffffffffffffffd4,0,4);
  this_00 = GetArenaNoVirtual((UninterpretedOption *)in_stack_ffffffffffffffb0);
  local_20 = in_RSI;
LAB_00530dc1:
  do {
    bVar1 = internal::ParseContext::Done
                      (in_stack_ffffffffffffffb0,(char **)in_stack_ffffffffffffffa8);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00531153;
    local_20 = internal::ReadTag((char *)in_RDX,
                                 (uint32 *)
                                 CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                          in_stack_ffffffffffffffd0),
                                 (uint32)((ulong)this_00 >> 0x20));
    if (local_20 == (char *)0x0) goto LAB_00531170;
    in_stack_ffffffffffffffb0 = (ParseContext *)(ulong)((in_stack_ffffffffffffffc4 >> 3) - 2);
    switch(in_stack_ffffffffffffffb0) {
    case (ParseContext *)0x0:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x12) {
        do {
          in_stack_ffffffffffffffa8 = in_RDX;
          in_RDX = in_stack_ffffffffffffffa8;
          _internal_add_name((UninterpretedOption *)0x530e7f);
          local_20 = internal::ParseContext::
                     ParseMessage<google::protobuf::UninterpretedOption_NamePart>
                               ((ParseContext *)this_00,
                                (UninterpretedOption_NamePart *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                (char *)in_RDI);
          if (local_20 == (char *)0x0) goto LAB_00531170;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            (&in_RDX->super_EpsCopyInputStream,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<18u>(local_20), bVar1));
        goto LAB_00530dc1;
      }
      break;
    case (ParseContext *)0x1:
      if ((in_stack_ffffffffffffffc4 & 0xff) != 0x1a) break;
      _internal_mutable_identifier_value_abi_cxx11_
                ((UninterpretedOption *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      local_20 = internal::InlineGreedyStringParserUTF8Verify
                           ((string *)
                            CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                     in_stack_ffffffffffffffd0),(char *)this_00,
                            (ParseContext *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (char *)in_RDI);
      goto joined_r0x005310e1;
    case (ParseContext *)0x2:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x20) {
        _Internal::set_has_positive_int_value((HasBits *)&stack0xffffffffffffffd4);
        uVar2 = internal::ReadVarint((char **)in_stack_ffffffffffffffb0);
        (in_RDI->super_EpsCopyInputStream).aliasing_ = uVar2;
        goto joined_r0x005310e1;
      }
      break;
    case (ParseContext *)0x3:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x28) {
        _Internal::set_has_negative_int_value((HasBits *)&stack0xffffffffffffffd4);
        uVar2 = internal::ReadVarint((char **)in_stack_ffffffffffffffb0);
        (in_RDI->super_EpsCopyInputStream).last_tag_minus_1_ = (int)uVar2;
        (in_RDI->super_EpsCopyInputStream).overall_limit_ = (int)(uVar2 >> 0x20);
        goto joined_r0x005310e1;
      }
      break;
    case (ParseContext *)0x4:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x31) {
        _Internal::set_has_double_value((HasBits *)&stack0xffffffffffffffd4);
        dVar3 = internal::UnalignedLoad<double>((char *)in_stack_ffffffffffffffb0);
        *(double *)&in_RDI->depth_ = dVar3;
        local_20 = local_20 + 8;
        goto LAB_00530dc1;
      }
      break;
    case (ParseContext *)0x5:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x3a) {
        _internal_mutable_string_value_abi_cxx11_
                  ((UninterpretedOption *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        local_20 = internal::InlineGreedyStringParser
                             ((string *)in_RDI,(char *)in_stack_ffffffffffffffb0,
                              in_stack_ffffffffffffffa8);
        goto joined_r0x005310e1;
      }
      break;
    case (ParseContext *)0x6:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x42) {
        _internal_mutable_aggregate_value_abi_cxx11_
                  ((UninterpretedOption *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        local_20 = internal::InlineGreedyStringParserUTF8Verify
                             ((string *)
                              CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                       in_stack_ffffffffffffffd0),(char *)this_00,
                              (ParseContext *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              (char *)in_RDI);
        goto joined_r0x005310e1;
      }
    }
    if (((in_stack_ffffffffffffffc4 & 7) == 4) || (in_stack_ffffffffffffffc4 == 0)) {
      internal::EpsCopyInputStream::SetLastTag
                (&in_RDX->super_EpsCopyInputStream,in_stack_ffffffffffffffc4);
      goto LAB_00531153;
    }
    local_20 = internal::UnknownFieldParse
                         ((uint32)in_stack_ffffffffffffffd4.has_bits_[0],
                          (InternalMetadataWithArena *)this_00,
                          (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_RDI);
joined_r0x005310e1:
    if (local_20 == (char *)0x0) {
LAB_00531170:
      local_20 = (char *)0x0;
LAB_00531153:
      internal::HasBits<1UL>::Or
                ((HasBits<1UL> *)&(in_RDI->super_EpsCopyInputStream).next_chunk_,
                 (HasBits<1UL> *)&stack0xffffffffffffffd4);
      return local_20;
    }
  } while( true );
}

Assistant:

const char* UninterpretedOption::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_name(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string identifier_value = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_identifier_value(), ptr, ctx, "google.protobuf.UninterpretedOption.identifier_value");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint64 positive_int_value = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_positive_int_value(&has_bits);
          positive_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int64 negative_int_value = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_negative_int_value(&has_bits);
          negative_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional double double_value = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 49)) {
          _Internal::set_has_double_value(&has_bits);
          double_value_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else goto handle_unusual;
        continue;
      // optional bytes string_value = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(_internal_mutable_string_value(), ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string aggregate_value = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_aggregate_value(), ptr, ctx, "google.protobuf.UninterpretedOption.aggregate_value");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}